

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExportInstallAndroidMKGenerator.cxx
# Opt level: O0

void __thiscall
cmExportInstallAndroidMKGenerator::GenerateImportHeaderCode
          (cmExportInstallAndroidMKGenerator *this,ostream *os,string *param_2)

{
  cmInstallTargetGenerator *pcVar1;
  cmTarget *this_00;
  byte bVar2;
  bool bVar3;
  TargetType TVar4;
  string *psVar5;
  char *pcVar6;
  ostream *poVar7;
  cmExportSet *pcVar8;
  vector<cmTargetExport_*,_std::allocator<cmTargetExport_*>_> *pvVar9;
  reference ppcVar10;
  allocator local_169;
  string local_168;
  allocator local_141;
  string local_140;
  string local_120;
  allocator local_f9;
  string local_f8;
  string local_d8;
  string local_b8 [8];
  string dest;
  cmTargetExport *te;
  __normal_iterator<cmTargetExport_*const_*,_std::vector<cmTargetExport_*,_std::allocator<cmTargetExport_*>_>_>
  local_88;
  const_iterator tei;
  size_t n;
  string path;
  size_t numDotDot;
  string local_40 [8];
  string installDir;
  string *param_2_local;
  ostream *os_local;
  cmExportInstallAndroidMKGenerator *this_local;
  
  installDir.field_2._8_8_ = param_2;
  psVar5 = cmInstallExportGenerator::GetDestination_abi_cxx11_
                     ((this->super_cmExportInstallFileGenerator).IEGen);
  std::__cxx11::string::string(local_40,(string *)psVar5);
  std::operator<<(os,"LOCAL_PATH := $(call my-dir)\n");
  pcVar6 = (char *)std::__cxx11::string::c_str();
  path.field_2._8_8_ = cmsys::SystemTools::CountChar(pcVar6,'/');
  bVar2 = std::__cxx11::string::empty();
  path.field_2._8_8_ = (long)(int)(uint)((bVar2 & 1) == 0) + path.field_2._8_8_;
  std::__cxx11::string::string((string *)&n);
  for (tei._M_current = (cmTargetExport **)0x0; tei._M_current < (ulong)path.field_2._8_8_;
      tei._M_current = tei._M_current + 1) {
    std::__cxx11::string::operator+=((string *)&n,"/..");
  }
  poVar7 = std::operator<<(os,"_IMPORT_PREFIX := ");
  poVar7 = std::operator<<(poVar7,"$(LOCAL_PATH)");
  poVar7 = std::operator<<(poVar7,(string *)&n);
  std::operator<<(poVar7,"\n\n");
  pcVar8 = cmInstallExportGenerator::GetExportSet((this->super_cmExportInstallFileGenerator).IEGen);
  pvVar9 = cmExportSet::GetTargetExports(pcVar8);
  local_88._M_current =
       (cmTargetExport **)
       std::vector<cmTargetExport_*,_std::allocator<cmTargetExport_*>_>::begin(pvVar9);
  while( true ) {
    pcVar8 = cmInstallExportGenerator::GetExportSet
                       ((this->super_cmExportInstallFileGenerator).IEGen);
    pvVar9 = cmExportSet::GetTargetExports(pcVar8);
    te = (cmTargetExport *)
         std::vector<cmTargetExport_*,_std::allocator<cmTargetExport_*>_>::end(pvVar9);
    bVar3 = __gnu_cxx::operator!=
                      (&local_88,
                       (__normal_iterator<cmTargetExport_*const_*,_std::vector<cmTargetExport_*,_std::allocator<cmTargetExport_*>_>_>
                        *)&te);
    if (!bVar3) break;
    ppcVar10 = __gnu_cxx::
               __normal_iterator<cmTargetExport_*const_*,_std::vector<cmTargetExport_*,_std::allocator<cmTargetExport_*>_>_>
               ::operator*(&local_88);
    dest.field_2._8_8_ = *ppcVar10;
    TVar4 = cmGeneratorTarget::GetType(((cmTargetExport *)dest.field_2._8_8_)->Target);
    if (TVar4 != INTERFACE_LIBRARY) {
      std::__cxx11::string::string(local_b8);
      if (*(long *)(dest.field_2._8_8_ + 0x38) != 0) {
        pcVar1 = *(cmInstallTargetGenerator **)(dest.field_2._8_8_ + 0x38);
        std::allocator<char>::allocator();
        std::__cxx11::string::string((string *)&local_f8,"",&local_f9);
        cmInstallTargetGenerator::GetDestination(&local_d8,pcVar1,&local_f8);
        std::__cxx11::string::operator=(local_b8,(string *)&local_d8);
        std::__cxx11::string::~string((string *)&local_d8);
        std::__cxx11::string::~string((string *)&local_f8);
        std::allocator<char>::~allocator((allocator<char> *)&local_f9);
      }
      if (*(long *)(dest.field_2._8_8_ + 0x28) != 0) {
        pcVar1 = *(cmInstallTargetGenerator **)(dest.field_2._8_8_ + 0x28);
        std::allocator<char>::allocator();
        std::__cxx11::string::string((string *)&local_140,"",&local_141);
        cmInstallTargetGenerator::GetDestination(&local_120,pcVar1,&local_140);
        std::__cxx11::string::operator=(local_b8,(string *)&local_120);
        std::__cxx11::string::~string((string *)&local_120);
        std::__cxx11::string::~string((string *)&local_140);
        std::allocator<char>::~allocator((allocator<char> *)&local_141);
      }
      this_00 = (cmTarget *)**(undefined8 **)(dest.field_2._8_8_ + 0x20);
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_168,"__dest",&local_169);
      pcVar6 = (char *)std::__cxx11::string::c_str();
      cmTarget::SetProperty(this_00,&local_168,pcVar6);
      std::__cxx11::string::~string((string *)&local_168);
      std::allocator<char>::~allocator((allocator<char> *)&local_169);
      std::__cxx11::string::~string(local_b8);
    }
    __gnu_cxx::
    __normal_iterator<cmTargetExport_*const_*,_std::vector<cmTargetExport_*,_std::allocator<cmTargetExport_*>_>_>
    ::operator++(&local_88);
  }
  std::__cxx11::string::~string((string *)&n);
  std::__cxx11::string::~string(local_40);
  return;
}

Assistant:

void cmExportInstallAndroidMKGenerator::GenerateImportHeaderCode(
  std::ostream& os, const std::string&)
{
  std::string installDir = this->IEGen->GetDestination();
  os << "LOCAL_PATH := $(call my-dir)\n";
  size_t numDotDot = cmSystemTools::CountChar(installDir.c_str(), '/');
  numDotDot += installDir.empty() ? 0 : 1;
  std::string path;
  for (size_t n = 0; n < numDotDot; n++) {
    path += "/..";
  }
  os << "_IMPORT_PREFIX := "
     << "$(LOCAL_PATH)" << path << "\n\n";
  for (std::vector<cmTargetExport*>::const_iterator tei =
         this->IEGen->GetExportSet()->GetTargetExports()->begin();
       tei != this->IEGen->GetExportSet()->GetTargetExports()->end(); ++tei) {
    // Collect import properties for this target.
    cmTargetExport const* te = *tei;
    if (te->Target->GetType() == cmStateEnums::INTERFACE_LIBRARY) {
      continue;
    }
    std::string dest;
    if (te->LibraryGenerator) {
      dest = te->LibraryGenerator->GetDestination("");
    }
    if (te->ArchiveGenerator) {
      dest = te->ArchiveGenerator->GetDestination("");
    }
    te->Target->Target->SetProperty("__dest", dest.c_str());
  }
}